

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O2

void __thiscall BmsNoteManager::Mirror(BmsNoteManager *this,int s,int e)

{
  uint uVar1;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *this_00;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *__t;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = ((e - s) + 1) / 2;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  this_00 = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
             *)(this->lanes_ + s);
  __t = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
         *)(this->lanes_ + e);
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    std::
    _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
    ::swap(this_00,__t);
    this_00 = this_00 + 0x30;
    __t = __t + -0x30;
  }
  return;
}

Assistant:

void BmsNoteManager::Mirror(int s, int e) {
	// soooooooo easy one
	// (excludes scratch)
	int keycount = e - s + 1;
	for (int i = 0; i < keycount / 2; i++) {
		int lane = s + i;
		int target = e - i;
		swap(lanes_[lane], lanes_[target]);
	}
}